

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_solver.cpp
# Opt level: O2

void __thiscall
Laplace2DProblem_iterative_solver_test_Test::~Laplace2DProblem_iterative_solver_test_Test
          (Laplace2DProblem_iterative_solver_test_Test *this)

{
  Laplace2DProblem::~Laplace2DProblem(&this->super_Laplace2DProblem);
  operator_delete(this,0x110);
  return;
}

Assistant:

TEST_F(Laplace2DProblem, iterative_solver_test) {

  Solver_Config data;
  data.type = Solver_Type::jacobi;
  data.maximum_iterations = 1000;
  data.convergence_tolerance = 1.0e-5;
  Solver solver = build_solver(data);

  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  Convergence_Data result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nJ:  " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";

  data.type = Solver_Type::gauss_seidel;
  solver = build_solver(data);
  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nGS:  " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";

  data.type = Solver_Type::successive_over_relaxation;
  data.SOR_relaxation = 1.5;
  solver = build_solver(data);
  std::fill(x_vector.begin(), x_vector.end(), 10.0);
  result = solver.solve(a_sparse, x_vector, b_vector);
  std::cout << "\nSOR: " << result.iteration << "\t" << result.residual_normalised << "\t" << result.duration.count()
            << "us";
  std::cout << "\n";
}